

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

void tlb_set_dirty_tricore(CPUState *cpu,target_ulong_conflict vaddr)

{
  CPUArchState_conflict28 *env_00;
  uint vaddr_00;
  CPUTLBEntry *tlb_entry;
  CPUTLB_conflict5 *pCVar1;
  int local_28;
  int local_24;
  int k;
  int mmu_idx;
  CPUArchState_conflict28 *env;
  target_ulong_conflict vaddr_local;
  CPUState *cpu_local;
  
  env_00 = (CPUArchState_conflict28 *)cpu->env_ptr;
  vaddr_00 = vaddr & 0xffffc000;
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    tlb_entry = ::tlb_entry(env_00,(long)local_24,vaddr_00);
    tlb_set_dirty1_locked(tlb_entry,vaddr_00);
  }
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
      pCVar1 = env_tlb(env_00);
      tlb_set_dirty1_locked(pCVar1->d[local_24].vtable + local_28,vaddr_00);
    }
  }
  return;
}

Assistant:

void tlb_set_dirty(CPUState *cpu, target_ulong vaddr)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    CPUArchState *env = cpu->env_ptr;
    int mmu_idx;

    // assert_cpu_is_self(cpu);

    vaddr &= TARGET_PAGE_MASK;
    for (mmu_idx = 0; mmu_idx < NB_MMU_MODES; mmu_idx++) {
        tlb_set_dirty1_locked(tlb_entry(env, mmu_idx, vaddr), vaddr);
    }

    for (mmu_idx = 0; mmu_idx < NB_MMU_MODES; mmu_idx++) {
        int k;
        for (k = 0; k < CPU_VTLB_SIZE; k++) {
            tlb_set_dirty1_locked(&env_tlb(env)->d[mmu_idx].vtable[k], vaddr);
        }
    }
}